

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

void Gia_ObjSetBufLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int in_EDX;
  int Fill;
  
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (uVar5 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar5 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x20d,"void Gia_ObjSetBufLevel(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar4 = pObj + -(ulong)uVar5;
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pGVar4) && (pGVar4 < pGVar2 + p->nObjs)) {
    uVar5 = (int)((long)pGVar4 - (long)pGVar2 >> 2) * -0x55555555;
    pVVar3 = p->vLevels;
    Vec_IntFillExtra(pVVar3,uVar5 + 1,in_EDX);
    if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pGVar4 = p->pObjs;
    if ((pGVar4 <= pObj) && (pObj < pGVar4 + p->nObjs)) {
      iVar1 = pVVar3->pArray[uVar5 & 0x7fffffff];
      uVar5 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      pVVar3 = p->vLevels;
      Vec_IntFillExtra(pVVar3,uVar5 + 1,Fill);
      if ((-1 < (int)uVar5) && ((int)uVar5 < pVVar3->nSize)) {
        pVVar3->pArray[uVar5 & 0x7fffffff] = iVar1;
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetBufLevel( Gia_Man_t * p, Gia_Obj_t * pObj ) { assert( Gia_ObjIsAnd(pObj) ); Gia_ObjSetLevel( p, pObj, Gia_ObjLevel(p,Gia_ObjFanin0(pObj)) );                                                }